

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall wasm::DAEScanner::visitRefFunc(DAEScanner *this,RefFunc *curr)

{
  mapped_type *pmVar1;
  key_type local_28;
  
  pmVar1 = this->info;
  if (pmVar1 == (mapped_type *)0x0) {
    local_28.super_IString.str._M_len = 0;
    local_28.super_IString.str._M_str = (char *)0x0;
    pmVar1 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->infoMap,&local_28);
  }
  std::__detail::
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&pmVar1->hasUnseenCalls,&curr->func);
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    // RefFunc may be visited from either a function, in which case |info| was
    // set, or module-level code (in which case we use the null function name in
    // the infoMap).
    auto* currInfo = info ? info : &(*infoMap)[Name()];

    // Treat a ref.func as an unseen call, preventing us from changing the
    // function's type. If we did change it, it could be an observable
    // difference from the outside, if the reference escapes, for example.
    // TODO: look for actual escaping?
    // TODO: create a thunk for external uses that allow internal optimizations
    currInfo->hasUnseenCalls.insert(curr->func);
  }